

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutableMessageGenerator::GenerateDescriptorMethods
          (ImmutableMessageGenerator *this,Printer *printer)

{
  FieldDescriptor *field_00;
  JavaType JVar1;
  Descriptor *pDVar2;
  FieldGeneratorInfo *pFVar3;
  int i_00;
  Descriptor *descriptor;
  Descriptor *descriptor_00;
  long lVar4;
  int i;
  long lVar5;
  ulong uVar6;
  FieldDescriptor *field;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  map_fields;
  string local_90;
  string local_70;
  string local_50;
  
  pDVar2 = (this->super_MessageGenerator).descriptor_;
  if (*(char *)(*(long *)(pDVar2 + 0x20) + 0x69) == '\0') {
    ClassNameResolver::GetImmutableClassName<google::protobuf::FileDescriptor>
              ((string *)&field,this->name_resolver_,*(FileDescriptor **)(pDVar2 + 0x10));
    UniqueFileScopeIdentifier_abi_cxx11_
              (&local_90,(java *)(this->super_MessageGenerator).descriptor_,descriptor);
    io::Printer::Print(printer,
                       "public static final com.google.protobuf.Descriptors.Descriptor\n    getDescriptor() {\n  return $fileclass$.internal_$identifier$_descriptor;\n}\n\n"
                       ,"fileclass",(string *)&field,"identifier",&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&field);
  }
  map_fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  map_fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  map_fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar4 = 0;
  for (lVar5 = 0; pDVar2 = (this->super_MessageGenerator).descriptor_,
      lVar5 < *(int *)(pDVar2 + 0x2c); lVar5 = lVar5 + 1) {
    field = (FieldDescriptor *)(*(long *)(pDVar2 + 0x30) + lVar4);
    JVar1 = GetJavaType(field);
    if (JVar1 == JAVATYPE_MESSAGE) {
      pDVar2 = FieldDescriptor::message_type(field);
      if (*(char *)(*(long *)(pDVar2 + 0x20) + 0x6b) == '\x01') {
        std::
        vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ::push_back(&map_fields,&field);
      }
    }
    lVar4 = lVar4 + 0xa8;
  }
  if (map_fields.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      map_fields.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    io::Printer::Print(printer,
                       "@SuppressWarnings({\"rawtypes\"})\nprotected com.google.protobuf.MapField internalGetMapField(\n    int number) {\n  switch (number) {\n"
                      );
    io::Printer::Indent(printer);
    io::Printer::Indent(printer);
    for (uVar6 = 0;
        uVar6 < (ulong)((long)map_fields.
                              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)map_fields.
                              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3); uVar6 = uVar6 + 1) {
      field_00 = map_fields.
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar6];
      pFVar3 = Context::GetFieldGeneratorInfo(this->context_,field_00);
      SimpleItoa_abi_cxx11_((string *)&field,(protobuf *)(ulong)*(uint *)(field_00 + 0x38),i_00);
      io::Printer::Print(printer,"case $number$:\n  return internalGet$capitalized_name$();\n",
                         "number",(string *)&field,"capitalized_name",&pFVar3->capitalized_name);
      std::__cxx11::string::~string((string *)&field);
    }
    io::Printer::Print(printer,
                       "default:\n  throw new RuntimeException(\n      \"Invalid map field number: \" + number);\n"
                      );
    io::Printer::Outdent(printer);
    io::Printer::Outdent(printer);
    io::Printer::Print(printer,"  }\n}\n");
    pDVar2 = (this->super_MessageGenerator).descriptor_;
  }
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            ((string *)&field,this->name_resolver_,pDVar2);
  ClassNameResolver::GetImmutableClassName<google::protobuf::FileDescriptor>
            (&local_90,this->name_resolver_,
             *(FileDescriptor **)((this->super_MessageGenerator).descriptor_ + 0x10));
  UniqueFileScopeIdentifier_abi_cxx11_
            (&local_50,(java *)(this->super_MessageGenerator).descriptor_,descriptor_00);
  GeneratedCodeVersionSuffix_abi_cxx11_();
  io::Printer::Print(printer,
                     "protected com.google.protobuf.GeneratedMessage$ver$.FieldAccessorTable\n    internalGetFieldAccessorTable() {\n  return $fileclass$.internal_$identifier$_fieldAccessorTable\n      .ensureFieldAccessorsInitialized(\n          $classname$.class, $classname$.Builder.class);\n}\n\n"
                     ,"classname",(string *)&field,"fileclass",&local_90,"identifier",&local_50,
                     "ver",&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&field);
  std::
  _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::~_Vector_base(&map_fields.
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 );
  return;
}

Assistant:

void ImmutableMessageGenerator::
GenerateDescriptorMethods(io::Printer* printer) {
  if (!descriptor_->options().no_standard_descriptor_accessor()) {
    printer->Print(
      "public static final com.google.protobuf.Descriptors.Descriptor\n"
      "    getDescriptor() {\n"
      "  return $fileclass$.internal_$identifier$_descriptor;\n"
      "}\n"
      "\n",
      "fileclass", name_resolver_->GetImmutableClassName(descriptor_->file()),
      "identifier", UniqueFileScopeIdentifier(descriptor_));
  }
  std::vector<const FieldDescriptor*> map_fields;
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    if (GetJavaType(field) == JAVATYPE_MESSAGE &&
        IsMapEntry(field->message_type())) {
      map_fields.push_back(field);
    }
  }
  if (!map_fields.empty()) {
    printer->Print(
      "@SuppressWarnings({\"rawtypes\"})\n"
      "protected com.google.protobuf.MapField internalGetMapField(\n"
      "    int number) {\n"
      "  switch (number) {\n");
    printer->Indent();
    printer->Indent();
    for (int i = 0; i < map_fields.size(); ++i) {
      const FieldDescriptor* field = map_fields[i];
      const FieldGeneratorInfo* info = context_->GetFieldGeneratorInfo(field);
      printer->Print(
        "case $number$:\n"
        "  return internalGet$capitalized_name$();\n",
        "number", SimpleItoa(field->number()),
        "capitalized_name", info->capitalized_name);
    }
    printer->Print(
        "default:\n"
        "  throw new RuntimeException(\n"
        "      \"Invalid map field number: \" + number);\n");
    printer->Outdent();
    printer->Outdent();
    printer->Print(
        "  }\n"
        "}\n");
  }
  printer->Print(
    "protected com.google.protobuf.GeneratedMessage$ver$.FieldAccessorTable\n"
    "    internalGetFieldAccessorTable() {\n"
    "  return $fileclass$.internal_$identifier$_fieldAccessorTable\n"
    "      .ensureFieldAccessorsInitialized(\n"
    "          $classname$.class, $classname$.Builder.class);\n"
    "}\n"
    "\n",
    "classname", name_resolver_->GetImmutableClassName(descriptor_),
    "fileclass", name_resolver_->GetImmutableClassName(descriptor_->file()),
    "identifier", UniqueFileScopeIdentifier(descriptor_),
    "ver", GeneratedCodeVersionSuffix());
}